

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_consumer.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_read_message(amqp_connection_state_t state,amqp_channel_t channel,amqp_message_t *message,
                 int flags)

{
  int iVar1;
  amqp_basic_properties_t *in_RCX;
  amqp_connection_state_t in_RDI;
  amqp_bytes_t aVar2;
  int res;
  char *body_read_ptr;
  size_t body_read;
  amqp_frame_t frame;
  amqp_pool_t *in_stack_ffffffffffffff68;
  amqp_basic_properties_t *in_stack_ffffffffffffff70;
  amqp_connection_state_t state_00;
  size_t local_78;
  void *local_70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  amqp_channel_t channel_00;
  amqp_connection_state_t in_stack_ffffffffffffffa8;
  char local_50;
  int local_48;
  undefined4 uStack_44;
  amqp_pool_table_entry_t *local_40;
  
  channel_00 = (amqp_channel_t)((ulong)in_stack_ffffffffffffffa0 >> 0x30);
  state_00 = in_RDI;
  memset(in_RDI,0,0x20);
  memset(in_RCX,0,0x118);
  iVar1 = amqp_simple_wait_frame_on_channel
                    (in_stack_ffffffffffffffa8,channel_00,
                     (amqp_frame_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar1 == 0) {
    if (local_50 == '\x02') {
      init_amqp_pool((amqp_pool_t *)&in_RCX[1].content_type.bytes,0x1000);
      iVar1 = amqp_basic_properties_clone
                        ((amqp_basic_properties_t *)state_00,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68);
      if (iVar1 == 0) {
        if (local_40 == (amqp_pool_table_entry_t *)0x0) {
          *(size_t *)(in_RCX + 1) = 0;
          in_RCX[1].content_type.len = (size_t)(void *)0x0;
        }
        else {
          in_stack_ffffffffffffff70 = in_RCX;
          aVar2 = amqp_bytes_malloc(0x107326);
          local_78 = aVar2.len;
          *(size_t *)(in_stack_ffffffffffffff70 + 1) = local_78;
          local_70 = aVar2.bytes;
          in_stack_ffffffffffffff70[1].content_type.len = (size_t)local_70;
          if (in_RCX[1].content_type.len == 0) {
            *(undefined4 *)state_00->pool_table = 2;
            *(undefined4 *)(state_00->pool_table + 3) = 0xffffffff;
            return (amqp_rpc_reply_t *)in_RDI;
          }
        }
        if (*(long *)(in_RCX + 1) == 0) {
          *(undefined4 *)state_00->pool_table = 1;
          return (amqp_rpc_reply_t *)in_RDI;
        }
        iVar1 = amqp_simple_wait_frame_on_channel
                          ((amqp_connection_state_t)0x0,
                           (amqp_channel_t)(in_RCX[1].content_type.len >> 0x30),
                           (amqp_frame_t *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
        if (iVar1 == 0) {
          *(undefined4 *)state_00->pool_table = 2;
          *(undefined4 *)(state_00->pool_table + 3) = 0xfffffffe;
        }
        else {
          *(undefined4 *)state_00->pool_table = 2;
          *(int *)(state_00->pool_table + 3) = iVar1;
        }
        aVar2.bytes = in_stack_ffffffffffffff70;
        aVar2.len = (size_t)in_stack_ffffffffffffff68;
        amqp_bytes_free(aVar2);
      }
      else {
        *(undefined4 *)state_00->pool_table = 2;
        *(int *)(state_00->pool_table + 3) = iVar1;
      }
      empty_amqp_pool((amqp_pool_t *)0x1074f7);
    }
    else if ((local_50 == '\x01') && ((local_48 == 0x140028 || (local_48 == 0xa0032)))) {
      *(undefined4 *)state_00->pool_table = 3;
      state_00->pool_table[1] = (amqp_pool_table_entry_t *)CONCAT44(uStack_44,local_48);
      state_00->pool_table[2] = local_40;
    }
    else {
      *(undefined4 *)state_00->pool_table = 2;
      *(undefined4 *)(state_00->pool_table + 3) = 0xfffffff0;
      amqp_put_back_frame(state_00,(amqp_frame_t *)in_stack_ffffffffffffff70);
    }
  }
  else {
    *(undefined4 *)state_00->pool_table = 2;
    *(int *)(state_00->pool_table + 3) = iVar1;
  }
  return (amqp_rpc_reply_t *)in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_read_message(amqp_connection_state_t state,
                                   amqp_channel_t channel,
                                   amqp_message_t *message,
                                   AMQP_UNUSED int flags) {
  amqp_frame_t frame;
  amqp_rpc_reply_t ret;

  size_t body_read;
  char *body_read_ptr;
  int res;

  memset(&ret, 0, sizeof(ret));
  memset(message, 0, sizeof(*message));

  res = amqp_simple_wait_frame_on_channel(state, channel, &frame);
  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;

    goto error_out1;
  }

  if (AMQP_FRAME_HEADER != frame.frame_type) {
    if (AMQP_FRAME_METHOD == frame.frame_type &&
        (AMQP_CHANNEL_CLOSE_METHOD == frame.payload.method.id ||
         AMQP_CONNECTION_CLOSE_METHOD == frame.payload.method.id)) {

      ret.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
      ret.reply = frame.payload.method;

    } else {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;

      amqp_put_back_frame(state, &frame);
    }
    goto error_out1;
  }

  init_amqp_pool(&message->pool, 4096);
  res = amqp_basic_properties_clone(frame.payload.properties.decoded,
                                    &message->properties, &message->pool);

  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    goto error_out3;
  }

  if (0 == frame.payload.properties.body_size) {
    message->body = amqp_empty_bytes;
  } else {
    if (SIZE_MAX < frame.payload.properties.body_size) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_NO_MEMORY;
      goto error_out1;
    }
    message->body =
        amqp_bytes_malloc((size_t)frame.payload.properties.body_size);
    if (NULL == message->body.bytes) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_NO_MEMORY;
      goto error_out1;
    }
  }

  body_read = 0;
  body_read_ptr = message->body.bytes;

  while (body_read < message->body.len) {
    res = amqp_simple_wait_frame_on_channel(state, channel, &frame);
    if (AMQP_STATUS_OK != res) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = res;
      goto error_out2;
    }
    if (AMQP_FRAME_BODY != frame.frame_type) {
      if (AMQP_FRAME_METHOD == frame.frame_type &&
          (AMQP_CHANNEL_CLOSE_METHOD == frame.payload.method.id ||
           AMQP_CONNECTION_CLOSE_METHOD == frame.payload.method.id)) {

        ret.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
        ret.reply = frame.payload.method;
      } else {
        ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
        ret.library_error = AMQP_STATUS_BAD_AMQP_DATA;
      }
      goto error_out2;
    }

    if (body_read + frame.payload.body_fragment.len > message->body.len) {
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_BAD_AMQP_DATA;
      goto error_out2;
    }

    memcpy(body_read_ptr, frame.payload.body_fragment.bytes,
           frame.payload.body_fragment.len);

    body_read += frame.payload.body_fragment.len;
    body_read_ptr += frame.payload.body_fragment.len;
  }

  ret.reply_type = AMQP_RESPONSE_NORMAL;
  return ret;

error_out2:
  amqp_bytes_free(message->body);
error_out3:
  empty_amqp_pool(&message->pool);
error_out1:
  return ret;
}